

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O0

Flow __thiscall Dinic::blocking(Dinic *this,int a,Flow val)

{
  int iVar1;
  long lVar2;
  int a_00;
  reference pvVar3;
  size_type sVar4;
  uint *puVar5;
  reference pvVar6;
  reference pvVar7;
  longlong *plVar8;
  Flow FVar9;
  Flow local_48;
  long local_40;
  Flow added;
  int b;
  int x;
  int *i;
  Flow val_local;
  Dinic *pDStack_18;
  int a_local;
  Dinic *this_local;
  
  this_local = (Dinic *)val;
  if ((a != this->T) && (val != 0)) {
    i = (int *)val;
    val_local._4_4_ = a;
    pDStack_18 = this;
    _b = std::vector<int,_std::allocator<int>_>::operator[](&this->pt,(long)a);
    while( true ) {
      iVar1 = *_b;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->g,(long)val_local._4_4_);
      sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
      if (sVar4 <= (ulong)(long)iVar1) break;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->g,(long)val_local._4_4_);
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)*_b);
      added._4_4_ = *puVar5;
      pvVar6 = std::vector<Edge,_std::allocator<Edge>_>::operator[](&this->e,(long)(int)added._4_4_)
      ;
      added._0_4_ = pvVar6->b;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->d,(long)(int)added);
      iVar1 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->d,(long)val_local._4_4_);
      a_00 = (int)added;
      if (iVar1 == *pvVar7 + 1) {
        pvVar6 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                           (&this->e,(long)(int)added._4_4_);
        local_48 = Edge::unused(pvVar6);
        plVar8 = std::min<long_long>((longlong *)&i,&local_48);
        FVar9 = blocking(this,a_00,*plVar8);
        if (FVar9 != 0) {
          local_40 = FVar9;
          pvVar6 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                             (&this->e,(long)(int)added._4_4_);
          lVar2 = local_40;
          pvVar6->flow = FVar9 + pvVar6->flow;
          pvVar6 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                             (&this->e,(long)(int)(added._4_4_ ^ 1));
          pvVar6->flow = pvVar6->flow - lVar2;
          return local_40;
        }
        local_40 = 0;
      }
      *_b = *_b + 1;
    }
    this_local = (Dinic *)0x0;
  }
  return (Flow)this_local;
}

Assistant:

Flow blocking(int a, Flow val) {
        if (a == T || val == 0) return val;
        for (int &i = pt[a]; i < g[a].size(); i++) {
            int x = g[a][i];
            int b = e[x].b;
            if (d[b] == d[a] + 1) {
                if (Flow added = blocking(b, min(val, e[x].unused()))) {
                    e[x].flow += added;
                    e[x ^ 1].flow -= added;
                    return added;
                }
            }
        }
        return 0;
    }